

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coroutine.c
# Opt level: O0

lgx_co_t * lgx_co_create(lgx_vm_t *vm,lgx_function_t *fun)

{
  int iVar1;
  lgx_co_t *plVar2;
  uint local_34;
  lgx_co_t *co;
  lgx_function_t *fun_local;
  lgx_vm_t *vm_local;
  
  if (vm->co_count < 0x100001) {
    if (fun->buildin == (_func_int_lgx_vm_s_ptr *)0x0) {
      vm_local = (lgx_vm_t *)calloc(1,0x68);
      if (vm_local == (lgx_vm_t *)0x0) {
        vm_local = (lgx_vm_t *)0x0;
      }
      else {
        if (fun->stack_size < 0x11) {
          local_34 = 0x10;
        }
        else {
          local_34 = fun->stack_size;
        }
        iVar1 = lgx_co_stack_init((lgx_co_stack_t *)&(vm_local->co_ready).prev,local_34);
        if (iVar1 == 0) {
          if (vm->co_running != (lgx_co_t *)0x0) {
            vm->co_running->ref_cnt = vm->co_running->ref_cnt + 1;
            *(lgx_co_s **)&vm_local->co_count = vm->co_running;
          }
          *(uint *)&(vm_local->co_suspend).prev = fun->addr;
          (vm_local->co_died).next = (lgx_list_s *)0x0;
          vm_local->co_id = (unsigned_long_long)vm;
          *(lgx_co_status *)&(vm_local->co_ready).next = CO_READY;
          lgx_list_add_tail((lgx_list_t *)vm_local,&vm->co_ready);
          lgx_co_set_function((lgx_co_t *)vm_local,0,fun);
          lgx_co_set_long((lgx_co_t *)vm_local,1,1);
          lgx_co_set_long((lgx_co_t *)vm_local,2,-1);
          lgx_co_set_long((lgx_co_t *)vm_local,3,-1);
          plVar2 = (lgx_co_t *)(vm->co_id + 1);
          vm->co_id = (unsigned_long_long)plVar2;
          vm_local->co_main = plVar2;
          vm->co_count = vm->co_count + 1;
        }
        else {
          free(vm_local);
          vm_local = (lgx_vm_t *)0x0;
        }
      }
    }
    else {
      vm_local = (lgx_vm_t *)0x0;
    }
  }
  else {
    vm_local = (lgx_vm_t *)0x0;
  }
  return (lgx_co_t *)vm_local;
}

Assistant:

lgx_co_t* lgx_co_create(lgx_vm_t *vm, lgx_function_t *fun) {
    if (vm->co_count > LGX_MAX_CO_LIMIT) {
        return NULL;
    }

    if (fun->buildin) {
        // 只支持为 xscript 函数创建协程
        return NULL;
    }

    lgx_co_t *co = (lgx_co_t *)xcalloc(1, sizeof(lgx_co_t));
    if (!co) {
        return NULL;
    }

    if (lgx_co_stack_init(&co->stack, fun->stack_size > 16 ? fun->stack_size : 16)) {
        xfree(co);
        return NULL;
    }

    if (vm->co_running) {
        vm->co_running->ref_cnt ++;
        co->parent = vm->co_running;
    }
    co->pc = fun->addr;
    co->on_yield = NULL;

    co->vm = vm;

    co->status = CO_READY;
    lgx_list_add_tail(&co->head, &vm->co_ready);

    // 初始化函数
    lgx_co_set_function(co, 0, fun);
    // 写入返回值地址
    lgx_co_set_long(co, 1, 1);
    // 写入返回地址
    lgx_co_set_long(co, 2, -1);
    // 写入堆栈地址
    lgx_co_set_long(co, 3, -1);

    co->id = ++vm->co_id;
    vm->co_count ++;

    return co;
}